

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfedge.cpp
# Opt level: O0

void __thiscall
graphics101::HalfEdgeTriMesh::build
          (HalfEdgeTriMesh *this,unsigned_long num_vertices,
          vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_> *triangles,
          Edges *edges)

{
  int iVar1;
  HalfEdgeIndex HVar2;
  bool bVar3;
  ulong uVar4;
  size_type sVar5;
  long lVar6;
  int *piVar7;
  int *piVar8;
  mapped_type *pmVar9;
  Index IVar10;
  mapped_type *pmVar11;
  reference pvVar12;
  Index *pIVar13;
  HalfEdge *pHVar14;
  mapped_type *pmVar15;
  size_type sVar16;
  reference this_00;
  size_type *psVar17;
  reference pvVar18;
  reference pHVar19;
  reference ppVar20;
  pair<long,_long> pVar21;
  pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>
  *it;
  iterator __end1_2;
  iterator __begin1_2;
  unordered_map<long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>_>_>
  *__range1_2;
  const_iterator local_308;
  iterator outgoing_hei;
  mapped_type *outgoing;
  HalfEdge *he_1;
  HalfEdgeIndex *hei_2;
  iterator __end1_1;
  iterator __begin1_1;
  HalfEdgeIndices *__range1_1;
  Index local_2c0;
  Index originating_vertex;
  HalfEdgeIndex *hei_1;
  iterator __end1;
  iterator __begin1;
  HalfEdgeIndices *__range1;
  unordered_map<long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>_>_>
  vertex2outgoing_boundary_hei;
  long local_250;
  Index j;
  Index i;
  Triangle *face;
  HalfEdgeIndex local_230;
  reference local_228;
  HalfEdge *he;
  undefined1 local_218 [4];
  int hei;
  HalfEdgeIndices boundary_heis;
  pair<long,_long> local_1f8;
  pair<int,_int> local_1e8;
  pair<long,_long> local_1e0;
  _Self local_1d0;
  pair<int,_int> local_1c8;
  pair<long,_long> local_1c0;
  _Self local_1b0;
  _Self local_1a8;
  pair<int,_int> local_1a0;
  pair<long,_long> local_198;
  _Self local_188;
  reference local_180;
  HalfEdge *he1;
  size_type local_150;
  HalfEdgeIndex local_148;
  HalfEdgeIndex he1index;
  HalfEdge *he0;
  size_type local_110;
  HalfEdgeIndex local_108;
  HalfEdgeIndex he0index;
  Edge *edge;
  Index IStack_f0;
  int ei;
  HalfEdgeIndex local_e8;
  Index local_e0;
  HalfEdgeIndex local_d8;
  Index local_d0;
  HalfEdgeIndex local_c8;
  pair<int,_int> local_c0;
  pair<long,_long> local_b8;
  pair<int,_int> local_a8;
  pair<long,_long> local_a0 [2];
  pair<int,_int> local_80;
  pair<long,_long> local_78;
  Triangle *local_68;
  Triangle *tri;
  undefined1 local_58 [4];
  int fi;
  directed_edge2index_map_t de2fi;
  Edges *edges_local;
  vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_> *triangles_local;
  unsigned_long num_vertices_local;
  HalfEdgeTriMesh *this_local;
  
  de2fi._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)edges;
  std::
  map<std::pair<long,_long>,_long,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long>_>_>
  ::map((map<std::pair<long,_long>,_long,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long>_>_>
         *)local_58);
  for (tri._4_4_ = 0; uVar4 = (ulong)tri._4_4_,
      sVar5 = std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>::size
                        (triangles), uVar4 < sVar5; tri._4_4_ = tri._4_4_ + 1) {
    local_68 = std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>::
               operator[](triangles,(long)tri._4_4_);
    lVar6 = (long)tri._4_4_;
    piVar7 = Triangle::operator[](local_68,0);
    piVar8 = Triangle::operator[](local_68,1);
    local_80 = std::make_pair<int_const&,int_const&>(piVar7,piVar8);
    std::pair<long,_long>::pair<int,_int,_true>(&local_78,&local_80);
    pmVar9 = std::
             map<std::pair<long,_long>,_long,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long>_>_>
             ::operator[]((map<std::pair<long,_long>,_long,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long>_>_>
                           *)local_58,&local_78);
    *pmVar9 = lVar6;
    lVar6 = (long)tri._4_4_;
    piVar7 = Triangle::operator[](local_68,1);
    piVar8 = Triangle::operator[](local_68,2);
    local_a8 = std::make_pair<int_const&,int_const&>(piVar7,piVar8);
    std::pair<long,_long>::pair<int,_int,_true>(local_a0,&local_a8);
    pmVar9 = std::
             map<std::pair<long,_long>,_long,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long>_>_>
             ::operator[]((map<std::pair<long,_long>,_long,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long>_>_>
                           *)local_58,local_a0);
    *pmVar9 = lVar6;
    lVar6 = (long)tri._4_4_;
    piVar7 = Triangle::operator[](local_68,2);
    piVar8 = Triangle::operator[](local_68,0);
    local_c0 = std::make_pair<int_const&,int_const&>(piVar7,piVar8);
    std::pair<long,_long>::pair<int,_int,_true>(&local_b8,&local_c0);
    pmVar9 = std::
             map<std::pair<long,_long>,_long,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long>_>_>
             ::operator[]((map<std::pair<long,_long>,_long,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long>_>_>
                           *)local_58,&local_b8);
    *pmVar9 = lVar6;
  }
  clear(this);
  local_d0 = -1;
  HalfEdgeIndex::HalfEdgeIndex(&local_c8,&local_d0);
  std::
  vector<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
  ::resize(&this->m_vertex_halfedges,num_vertices,&local_c8);
  sVar5 = std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>::size
                    (triangles);
  local_e0 = -1;
  HalfEdgeIndex::HalfEdgeIndex(&local_d8,&local_e0);
  std::
  vector<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
  ::resize(&this->m_face_halfedges,sVar5,&local_d8);
  sVar5 = std::
          vector<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
          ::size((vector<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
                  *)de2fi._M_t._M_impl.super__Rb_tree_header._M_node_count);
  IStack_f0 = -1;
  HalfEdgeIndex::HalfEdgeIndex(&local_e8,&stack0xffffffffffffff10);
  std::
  vector<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
  ::resize(&this->m_edge_halfedges,sVar5,&local_e8);
  sVar5 = std::
          vector<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
          ::size((vector<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
                  *)de2fi._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  vector<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
  ::reserve(&this->m_halfedges,sVar5 * 2);
  edge._4_4_ = 0;
  while( true ) {
    sVar5 = std::
            vector<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
            ::size((vector<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
                    *)de2fi._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (sVar5 <= (ulong)(long)edge._4_4_) {
      std::
      vector<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
      ::vector((vector<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
                *)local_218);
      he._4_4_ = 0;
      do {
        uVar4 = (ulong)he._4_4_;
        sVar5 = std::
                vector<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
                ::size(&this->m_halfedges);
        if (sVar5 <= uVar4) {
          std::
          unordered_map<long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>_>_>
          ::unordered_map((unordered_map<long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>_>_>
                           *)&__range1);
          __end1 = std::
                   vector<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
                   ::begin((vector<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
                            *)local_218);
          hei_1 = (HalfEdgeIndex *)
                  std::
                  vector<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
                  ::end((vector<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
                         *)local_218);
          while (bVar3 = __gnu_cxx::operator!=
                                   (&__end1,(__normal_iterator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex_*,_std::vector<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>
                                             *)&hei_1), bVar3) {
            originating_vertex =
                 (Index)__gnu_cxx::
                        __normal_iterator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex_*,_std::vector<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>
                        ::operator*(&__end1);
            pHVar14 = halfedge(this,(HalfEdgeIndex *)originating_vertex);
            pHVar14 = halfedge(this,&pHVar14->opposite_he);
            local_2c0 = pHVar14->to_vertex;
            pmVar15 = std::
                      unordered_map<long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>_>_>
                      ::operator[]((unordered_map<long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>_>_>
                                    *)&__range1,&local_2c0);
            std::
            set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
            ::insert(pmVar15,(value_type *)originating_vertex);
            pmVar15 = std::
                      unordered_map<long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>_>_>
                      ::operator[]((unordered_map<long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>_>_>
                                    *)&__range1,&local_2c0);
            sVar16 = std::
                     set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
                     ::size(pmVar15);
            if (1 < sVar16) {
              std::operator<<((ostream *)&std::cerr,"Butterfly vertex encountered.\n");
            }
            __gnu_cxx::
            __normal_iterator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex_*,_std::vector<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>
            ::operator++(&__end1);
          }
          __end1_1 = std::
                     vector<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
                     ::begin((vector<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
                              *)local_218);
          hei_2 = (HalfEdgeIndex *)
                  std::
                  vector<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
                  ::end((vector<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
                         *)local_218);
          while (bVar3 = __gnu_cxx::operator!=
                                   (&__end1_1,
                                    (__normal_iterator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex_*,_std::vector<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>
                                     *)&hei_2), bVar3) {
            this_00 = __gnu_cxx::
                      __normal_iterator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex_*,_std::vector<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>
                      ::operator*(&__end1_1);
            psVar17 = (size_type *)HalfEdgeIndex::operator_cast_to_long_(this_00);
            pvVar18 = std::
                      vector<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
                      ::operator[](&this->m_halfedges,*psVar17);
            outgoing_hei._M_node =
                 (_Base_ptr)
                 std::
                 unordered_map<long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>_>_>
                 ::operator[]((unordered_map<long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>_>_>
                               *)&__range1,&pvVar18->to_vertex);
            bVar3 = std::
                    set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
                    ::empty((set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
                             *)outgoing_hei._M_node);
            if (!bVar3) {
              local_308._M_node =
                   (_Base_ptr)
                   std::
                   set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
                   ::begin(outgoing_hei._M_node);
              pHVar19 = std::_Rb_tree_const_iterator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>::
                        operator*(&local_308);
              (pvVar18->next_he).value = pHVar19->value;
              std::
              set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>>
              ::erase_abi_cxx11_((set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>>
                                  *)outgoing_hei._M_node,local_308);
            }
            __gnu_cxx::
            __normal_iterator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex_*,_std::vector<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>
            ::operator++(&__end1_1);
          }
          __end1_2 = std::
                     unordered_map<long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>_>_>
                     ::begin((unordered_map<long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>_>_>
                              *)&__range1);
          it = (pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>
                *)std::
                  unordered_map<long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>_>_>
                  ::end((unordered_map<long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>_>_>
                         *)&__range1);
          while( true ) {
            bVar3 = std::__detail::operator!=
                              (&__end1_2.
                                super__Node_iterator_base<std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>,_false>
                               ,(_Node_iterator_base<std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>,_false>
                                 *)&it);
            if (!bVar3) {
              std::
              unordered_map<long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>_>_>
              ::~unordered_map((unordered_map<long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>_>_>
                                *)&__range1);
              std::
              vector<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
              ::~vector((vector<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
                         *)local_218);
              std::
              map<std::pair<long,_long>,_long,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long>_>_>
              ::~map((map<std::pair<long,_long>,_long,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long>_>_>
                      *)local_58);
              return;
            }
            ppVar20 = std::__detail::
                      _Node_iterator<std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>,_false,_false>
                      ::operator*(&__end1_2);
            bVar3 = std::
                    set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
                    ::empty(&ppVar20->second);
            if (!bVar3) break;
            std::__detail::
            _Node_iterator<std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>,_false,_false>
            ::operator++(&__end1_2);
          }
          __assert_fail("it.second.empty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/yig[P]graphics101-meshes/src/halfedge.cpp"
                        ,0x12a,
                        "void graphics101::HalfEdgeTriMesh::build(const unsigned long, const std::vector<Triangle> &, const Edges &)"
                       );
        }
        local_228 = std::
                    vector<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
                    ::at(&this->m_halfedges,(long)he._4_4_);
        if (local_228->face == -1) {
          face = (Triangle *)(long)he._4_4_;
          HalfEdgeIndex::HalfEdgeIndex(&local_230,(Index *)&face);
          std::
          vector<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
          ::push_back((vector<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
                       *)local_218,&local_230);
        }
        else {
          i = (Index)std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>::
                     operator[](triangles,local_228->face);
          j = local_228->to_vertex;
          local_250 = -1;
          piVar7 = Triangle::operator[]((Triangle *)i,0);
          if (*piVar7 == j) {
            piVar7 = Triangle::operator[]((Triangle *)i,1);
            local_250 = (long)*piVar7;
          }
          else {
            piVar7 = Triangle::operator[]((Triangle *)i,1);
            if (*piVar7 == j) {
              piVar7 = Triangle::operator[]((Triangle *)i,2);
              local_250 = (long)*piVar7;
            }
            else {
              piVar7 = Triangle::operator[]((Triangle *)i,2);
              if (*piVar7 == j) {
                piVar7 = Triangle::operator[]((Triangle *)i,0);
                local_250 = (long)*piVar7;
              }
            }
          }
          if (local_250 == -1) {
            __assert_fail("-1 != j",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/yig[P]graphics101-meshes/src/halfedge.cpp"
                          ,0x107,
                          "void graphics101::HalfEdgeTriMesh::build(const unsigned long, const std::vector<Triangle> &, const Edges &)"
                         );
          }
          pVar21 = std::make_pair<long_const&,long&>(&j,&local_250);
          vertex2outgoing_boundary_hei._M_h._M_single_bucket = (__node_base_ptr)pVar21.first;
          pmVar11 = std::
                    map<std::pair<long,_long>,_graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>
                    ::operator[](&this->m_directed_edge2he_index,
                                 (key_type *)&vertex2outgoing_boundary_hei._M_h._M_single_bucket);
          (local_228->next_he).value = pmVar11->value;
        }
        he._4_4_ = he._4_4_ + 1;
      } while( true );
    }
    he0index.value =
         (Index)std::
                vector<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
                ::operator[]((vector<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
                              *)de2fi._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             (long)edge._4_4_);
    local_110 = std::
                vector<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
                ::size(&this->m_halfedges);
    HalfEdgeIndex::HalfEdgeIndex(&local_108,(Index *)&local_110);
    HalfEdge::HalfEdge((HalfEdge *)&he0);
    std::
    vector<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
    ::push_back(&this->m_halfedges,(value_type *)&he0);
    he1index.value =
         (Index)std::
                vector<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
                ::back(&this->m_halfedges);
    local_150 = std::
                vector<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
                ::size(&this->m_halfedges);
    HalfEdgeIndex::HalfEdgeIndex(&local_148,(Index *)&local_150);
    HalfEdge::HalfEdge((HalfEdge *)&he1);
    std::
    vector<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
    ::push_back(&this->m_halfedges,(value_type *)&he1);
    local_180 = std::
                vector<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
                ::back(&this->m_halfedges);
    piVar7 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                       ((vec<2,_int,_(glm::qualifier)0> *)he0index.value,0);
    iVar1 = *piVar7;
    piVar7 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                       ((vec<2,_int,_(glm::qualifier)0> *)he0index.value,1);
    IVar10 = anon_unknown.dwarf_598d2::directed_edge2face_index
                       ((directed_edge2index_map_t *)local_58,(long)iVar1,(long)*piVar7);
    *(Index *)(he1index.value + 8) = IVar10;
    piVar7 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                       ((vec<2,_int,_(glm::qualifier)0> *)he0index.value,1);
    *(long *)he1index.value = (long)*piVar7;
    *(long *)(he1index.value + 0x10) = (long)edge._4_4_;
    piVar7 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                       ((vec<2,_int,_(glm::qualifier)0> *)he0index.value,1);
    iVar1 = *piVar7;
    piVar7 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                       ((vec<2,_int,_(glm::qualifier)0> *)he0index.value,0);
    IVar10 = anon_unknown.dwarf_598d2::directed_edge2face_index
                       ((directed_edge2index_map_t *)local_58,(long)iVar1,(long)*piVar7);
    local_180->face = IVar10;
    piVar7 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                       ((vec<2,_int,_(glm::qualifier)0> *)he0index.value,0);
    local_180->to_vertex = (long)*piVar7;
    local_180->edge = (long)edge._4_4_;
    *(Index *)(he1index.value + 0x18) = local_148.value;
    (local_180->opposite_he).value = local_108.value;
    piVar7 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                       ((vec<2,_int,_(glm::qualifier)0> *)he0index.value,0);
    piVar8 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                       ((vec<2,_int,_(glm::qualifier)0> *)he0index.value,1);
    local_1a0 = std::make_pair<int_const&,int_const&>(piVar7,piVar8);
    std::pair<long,_long>::pair<int,_int,_true>(&local_198,&local_1a0);
    local_188._M_node =
         (_Base_ptr)
         std::
         map<std::pair<long,_long>,_graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>
         ::find(&this->m_directed_edge2he_index,&local_198);
    local_1a8._M_node =
         (_Base_ptr)
         std::
         map<std::pair<long,_long>,_graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>
         ::end(&this->m_directed_edge2he_index);
    bVar3 = std::operator==(&local_188,&local_1a8);
    if (!bVar3) {
      __assert_fail("m_directed_edge2he_index.find( std::make_pair( edge[0], edge[1] ) ) == m_directed_edge2he_index.end()"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/yig[P]graphics101-meshes/src/halfedge.cpp"
                    ,0xcc,
                    "void graphics101::HalfEdgeTriMesh::build(const unsigned long, const std::vector<Triangle> &, const Edges &)"
                   );
    }
    piVar7 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                       ((vec<2,_int,_(glm::qualifier)0> *)he0index.value,1);
    piVar8 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                       ((vec<2,_int,_(glm::qualifier)0> *)he0index.value,0);
    local_1c8 = std::make_pair<int_const&,int_const&>(piVar7,piVar8);
    std::pair<long,_long>::pair<int,_int,_true>(&local_1c0,&local_1c8);
    local_1b0._M_node =
         (_Base_ptr)
         std::
         map<std::pair<long,_long>,_graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>
         ::find(&this->m_directed_edge2he_index,&local_1c0);
    local_1d0._M_node =
         (_Base_ptr)
         std::
         map<std::pair<long,_long>,_graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>
         ::end(&this->m_directed_edge2he_index);
    bVar3 = std::operator==(&local_1b0,&local_1d0);
    if (!bVar3) break;
    piVar7 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                       ((vec<2,_int,_(glm::qualifier)0> *)he0index.value,0);
    piVar8 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                       ((vec<2,_int,_(glm::qualifier)0> *)he0index.value,1);
    local_1e8 = std::make_pair<int_const&,int_const&>(piVar7,piVar8);
    std::pair<long,_long>::pair<int,_int,_true>(&local_1e0,&local_1e8);
    pmVar11 = std::
              map<std::pair<long,_long>,_graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>
              ::operator[](&this->m_directed_edge2he_index,&local_1e0);
    pmVar11->value = local_108.value;
    piVar7 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                       ((vec<2,_int,_(glm::qualifier)0> *)he0index.value,1);
    piVar8 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                       ((vec<2,_int,_(glm::qualifier)0> *)he0index.value,0);
    boundary_heis.
    super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::make_pair<int_const&,int_const&>(piVar7,piVar8);
    std::pair<long,_long>::pair<int,_int,_true>
              (&local_1f8,
               (pair<int,_int> *)
               &boundary_heis.
                super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pmVar11 = std::
              map<std::pair<long,_long>,_graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>
              ::operator[](&this->m_directed_edge2he_index,&local_1f8);
    pmVar11->value = local_148.value;
    pvVar12 = std::
              vector<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
              ::operator[](&this->m_vertex_halfedges,*(size_type *)he1index.value);
    pIVar13 = HalfEdgeIndex::operator_cast_to_long_(pvVar12);
    HVar2 = he1index;
    if ((*pIVar13 == -1) || (local_180->face == -1)) {
      pvVar12 = std::
                vector<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
                ::operator[](&this->m_vertex_halfedges,*(size_type *)he1index.value);
      pvVar12->value = *(Index *)(HVar2.value + 0x18);
    }
    pvVar12 = std::
              vector<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
              ::operator[](&this->m_vertex_halfedges,local_180->to_vertex);
    pIVar13 = HalfEdgeIndex::operator_cast_to_long_(pvVar12);
    pvVar18 = local_180;
    if ((*pIVar13 == -1) || (*(long *)(he1index.value + 8) == -1)) {
      pvVar12 = std::
                vector<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
                ::operator[](&this->m_vertex_halfedges,local_180->to_vertex);
      pvVar12->value = (pvVar18->opposite_he).value;
    }
    if (*(long *)(he1index.value + 8) != -1) {
      pvVar12 = std::
                vector<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
                ::operator[](&this->m_face_halfedges,*(size_type *)(he1index.value + 8));
      pIVar13 = HalfEdgeIndex::operator_cast_to_long_(pvVar12);
      if (*pIVar13 == -1) {
        pvVar12 = std::
                  vector<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
                  ::operator[](&this->m_face_halfedges,*(size_type *)(he1index.value + 8));
        pvVar12->value = local_108.value;
      }
    }
    if (local_180->face != -1) {
      pvVar12 = std::
                vector<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
                ::operator[](&this->m_face_halfedges,local_180->face);
      pIVar13 = HalfEdgeIndex::operator_cast_to_long_(pvVar12);
      if (*pIVar13 == -1) {
        pvVar12 = std::
                  vector<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
                  ::operator[](&this->m_face_halfedges,local_180->face);
        pvVar12->value = local_148.value;
      }
    }
    pvVar12 = std::
              vector<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
              ::operator[](&this->m_edge_halfedges,(long)edge._4_4_);
    pIVar13 = HalfEdgeIndex::operator_cast_to_long_(pvVar12);
    if (*pIVar13 != -1) {
      __assert_fail("m_edge_halfedges[ ei ] == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/yig[P]graphics101-meshes/src/halfedge.cpp"
                    ,0xef,
                    "void graphics101::HalfEdgeTriMesh::build(const unsigned long, const std::vector<Triangle> &, const Edges &)"
                   );
    }
    pvVar12 = std::
              vector<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
              ::operator[](&this->m_edge_halfedges,(long)edge._4_4_);
    pvVar12->value = local_108.value;
    edge._4_4_ = edge._4_4_ + 1;
  }
  __assert_fail("m_directed_edge2he_index.find( std::make_pair( edge[1], edge[0] ) ) == m_directed_edge2he_index.end()"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/yig[P]graphics101-meshes/src/halfedge.cpp"
                ,0xcd,
                "void graphics101::HalfEdgeTriMesh::build(const unsigned long, const std::vector<Triangle> &, const Edges &)"
               );
}

Assistant:

void HalfEdgeTriMesh::build( const unsigned long num_vertices, const std::vector< Triangle >& triangles, const Edges& edges )
{
    /*
    Generates all half edge data structures for the mesh given by its vertices 'self.vs'
    and faces 'self.faces'.

    Python version used heavily
    */

    directed_edge2index_map_t de2fi;
    for( int fi = 0; fi < triangles.size(); ++fi )
    {
        const Triangle& tri = triangles[fi];
        de2fi[ std::make_pair( tri[0], tri[1] ) ] = fi;
        de2fi[ std::make_pair( tri[1], tri[2] ) ] = fi;
        de2fi[ std::make_pair( tri[2], tri[0] ) ] = fi;
    }

    // Clear any previous data we store.
    clear();
    m_vertex_halfedges.resize( num_vertices, HalfEdgeIndex(-1) );
    m_face_halfedges.resize( triangles.size(), HalfEdgeIndex(-1) );
    m_edge_halfedges.resize( edges.size(), HalfEdgeIndex(-1) );
    m_halfedges.reserve( edges.size()*2 );

    for( int ei = 0; ei < edges.size(); ++ei )
    {
        const Edge& edge = edges[ei];

        // Add the HalfEdge structures to the end of the list.
        const HalfEdgeIndex he0index( m_halfedges.size() );
        m_halfedges.push_back( HalfEdge() );
        HalfEdge& he0 = m_halfedges.back();

        const HalfEdgeIndex he1index( m_halfedges.size() );
        m_halfedges.push_back( HalfEdge() );
        HalfEdge& he1 = m_halfedges.back();

        // The face will be -1 if it is a boundary half-edge.
        he0.face = directed_edge2face_index( de2fi, edge[0], edge[1] );
        he0.to_vertex = edge[1];
        he0.edge = ei;

        // The face will be -1 if it is a boundary half-edge.
        he1.face = directed_edge2face_index( de2fi, edge[1], edge[0] );
        he1.to_vertex = edge[0];
        he1.edge = ei;

        // Store the opposite half-edge index.
        he0.opposite_he = he1index;
        he1.opposite_he = he0index;

        // Also store the index in our m_directed_edge2he_index map.
        assert( m_directed_edge2he_index.find( std::make_pair( edge[0], edge[1] ) ) == m_directed_edge2he_index.end() );
        assert( m_directed_edge2he_index.find( std::make_pair( edge[1], edge[0] ) ) == m_directed_edge2he_index.end() );
        m_directed_edge2he_index[ std::make_pair( edge[0], edge[1] ) ] = he0index;
        m_directed_edge2he_index[ std::make_pair( edge[1], edge[0] ) ] = he1index;

        // If the vertex pointed to by a half-edge doesn't yet have an out-going
        // halfedge, store the opposite halfedge.
        // Also, if the vertex is a boundary vertex, make sure its
        // out-going halfedge is a boundary halfedge.
        // NOTE: Halfedge data structure can't properly handle butterfly vertices.
        //       If the mesh has butterfly vertices, there will be multiple outgoing
        //       boundary halfedges.  Because we have to pick one as the vertex's outgoing
        //       halfedge, we can't iterate over all neighbors, only a single wing of the
        //       butterfly.
        if( m_vertex_halfedges[ he0.to_vertex ] == -1 || -1 == he1.face )
        {
            m_vertex_halfedges[ he0.to_vertex ] = he0.opposite_he;
        }
        if( m_vertex_halfedges[ he1.to_vertex ] == -1 || -1 == he0.face )
        {
            m_vertex_halfedges[ he1.to_vertex ] = he1.opposite_he;
        }

        // If the face pointed to by a half-edge doesn't yet have a
        // halfedge pointing to it, store the halfedge.
        if( -1 != he0.face && m_face_halfedges[ he0.face ] == -1 )
        {
            m_face_halfedges[ he0.face ] = he0index;
        }
        if( -1 != he1.face && m_face_halfedges[ he1.face ] == -1 )
        {
            m_face_halfedges[ he1.face ] = he1index;
        }

        // Store one of the half-edges for the edge.
        assert( m_edge_halfedges[ ei ] == -1 );
        m_edge_halfedges[ ei ] = he0index;
    }

    // Now that all the half-edges are created, set the remaining next_he field.
    // We can't yet handle boundary halfedges, so store them for later.
    HalfEdgeIndices boundary_heis;
    for( int hei = 0; hei < m_halfedges.size(); ++hei )
    {
        HalfEdge& he = m_halfedges.at( hei );
        // Store boundary halfedges for later.
        if( -1 == he.face )
        {
            boundary_heis.push_back( HalfEdgeIndex( hei ) );
            continue;
        }

        const Triangle& face = triangles[ he.face ];
        const Index i = he.to_vertex;

        Index j = -1;
        if( face[0] == i ) j = face[1];
        else if( face[1] == i ) j = face[2];
        else if( face[2] == i ) j = face[0];
        assert( -1 != j );

        he.next_he = m_directed_edge2he_index[ std::make_pair(i,j) ];
    }

    // Make a map from vertices to boundary halfedges (indices) originating from them.
    // NOTE: There will only be multiple originating boundary halfedges at butterfly vertices.
    std::unordered_map< Index, std::set< HalfEdgeIndex > > vertex2outgoing_boundary_hei;
    for( const auto& hei : boundary_heis )
    {
        const Index originating_vertex = halfedge( halfedge( hei ).opposite_he ).to_vertex;
        vertex2outgoing_boundary_hei[ originating_vertex ].insert( hei );
        if( vertex2outgoing_boundary_hei[ originating_vertex ].size() > 1 )
        {
            std::cerr << "Butterfly vertex encountered.\n";
        }
    }

    // For each boundary halfedge, make its next_he one of the boundary halfedges
    // originating at its to_vertex.
    for( const auto& hei : boundary_heis )
    {
        HalfEdge& he = m_halfedges[ hei ];

        auto& outgoing = vertex2outgoing_boundary_hei[ he.to_vertex ];
        if( !outgoing.empty() )
        {
            auto outgoing_hei = outgoing.begin();
            he.next_he = *outgoing_hei;

            outgoing.erase( outgoing_hei );
        }
    }

#ifndef NDEBUG
    for( const auto& it : vertex2outgoing_boundary_hei ) { assert( it.second.empty() ); }
#endif
}